

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::FragOpInteractionCase::ReferenceContext::ReferenceContext
          (ReferenceContext *this,RenderContext *renderCtx,int width,int height)

{
  ReferenceContextBuffers *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MultisamplePixelBufferAccess local_a8;
  MultisamplePixelBufferAccess local_80;
  MultisamplePixelBufferAccess local_58;
  
  sglr::ReferenceContextLimits::ReferenceContextLimits(&this->limits,renderCtx);
  iVar1 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar2 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x18);
  iVar3 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  this_00 = &this->buffers;
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_00,(PixelFormat *)(CONCAT44(extraout_var,iVar1) + 8),iVar2,
             *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x1c),width,height,1);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_58,this_00);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_80,this_00);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_a8,this_00);
  sglr::ReferenceContext::ReferenceContext
            (&this->context,&this->limits,&local_58,&local_80,&local_a8);
  return;
}

Assistant:

ReferenceContext (glu::RenderContext& renderCtx, int width, int height)
		: limits	(renderCtx)
		, buffers	(renderCtx.getRenderTarget().getPixelFormat(), renderCtx.getRenderTarget().getDepthBits(), renderCtx.getRenderTarget().getStencilBits(), width, height)
		, context	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer())
	{
	}